

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

ArraySet * __thiscall
wasm::Builder::makeArraySet(Builder *this,Expression *ref,Expression *index,Expression *value)

{
  ArraySet *pAVar1;
  
  pAVar1 = MixedArena::alloc<wasm::ArraySet>(&this->wasm->allocator);
  pAVar1->ref = ref;
  pAVar1->index = index;
  pAVar1->value = value;
  wasm::ArraySet::finalize();
  return pAVar1;
}

Assistant:

ArraySet*
  makeArraySet(Expression* ref, Expression* index, Expression* value) {
    auto* ret = wasm.allocator.alloc<ArraySet>();
    ret->ref = ref;
    ret->index = index;
    ret->value = value;
    ret->finalize();
    return ret;
  }